

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int xferOptimization(Parse *pParse,Table *pDest,Select *pSelect,int onError,int iDbDest)

{
  int iCur;
  sqlite3 *db_00;
  bool bVar1;
  int iVar2;
  int iDb;
  int iVar3;
  int p2;
  int p2_00;
  int iVar4;
  Table *pTab;
  Column *pCol;
  Column *pCol_00;
  Expr *pEVar5;
  Expr *pEVar6;
  char *zLeft;
  char *zRight;
  Vdbe *p;
  char *zColl;
  u8 idxInsFlags;
  u8 insFlags;
  Expr *pSrcExpr;
  Expr *pDestExpr;
  Column *pSrcCol;
  Column *pDestCol;
  int regRowid;
  int regData;
  int destHasUniqueIdx;
  int regAutoinc;
  Vdbe *v;
  int emptySrcTest;
  int emptyDestTest;
  int addr2;
  int addr1;
  int iDest;
  int iSrc;
  int iDbSrc;
  int i;
  SrcItem *pItem;
  Index *pDestIdx;
  Index *pSrcIdx;
  Table *pSrc;
  ExprList *pEList;
  sqlite3 *db;
  int iDbDest_local;
  int onError_local;
  Select *pSelect_local;
  Table *pDest_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  v._4_4_ = 0;
  v._0_4_ = 0;
  bVar1 = false;
  if ((pParse->pWith == (With *)0x0) && (pSelect->pWith == (With *)0x0)) {
    if (pDest->eTabType == '\x01') {
      pParse_local._4_4_ = 0;
    }
    else {
      db._4_4_ = onError;
      if (onError == 0xb) {
        if (-1 < pDest->iPKey) {
          db._4_4_ = (uint)pDest->keyConf;
        }
        if (db._4_4_ == 0xb) {
          db._4_4_ = 2;
        }
      }
      if (pSelect->pSrc->nSrc == 1) {
        if (pSelect->pSrc->a[0].pSelect == (Select *)0x0) {
          if (pSelect->pWhere == (Expr *)0x0) {
            if (pSelect->pOrderBy == (ExprList *)0x0) {
              if (pSelect->pGroupBy == (ExprList *)0x0) {
                if (pSelect->pLimit == (Expr *)0x0) {
                  if (pSelect->pPrior == (Select *)0x0) {
                    if ((pSelect->selFlags & 1) == 0) {
                      if (pSelect->pEList->nExpr == 1) {
                        if ((pSelect->pEList->a[0].pExpr)->op == 0xb4) {
                          pTab = sqlite3LocateTableItem(pParse,0,pSelect->pSrc->a);
                          if (pTab == (Table *)0x0) {
                            pParse_local._4_4_ = 0;
                          }
                          else if ((pTab->tnum == pDest->tnum) && (pTab->pSchema == pDest->pSchema))
                          {
                            pParse_local._4_4_ = 0;
                          }
                          else if (((pDest->tabFlags & 0x80) == 0) == ((pTab->tabFlags & 0x80) == 0)
                                  ) {
                            if (pTab->eTabType == '\0') {
                              if (pDest->nCol == pTab->nCol) {
                                if (pDest->iPKey == pTab->iPKey) {
                                  if (((pDest->tabFlags & 0x10000) == 0) ||
                                     ((pTab->tabFlags & 0x10000) != 0)) {
                                    for (iSrc = 0; iSrc < pDest->nCol; iSrc = iSrc + 1) {
                                      pCol = pDest->aCol + iSrc;
                                      pCol_00 = pTab->aCol + iSrc;
                                      if ((pCol->colFlags & 0x60) != (pCol_00->colFlags & 0x60)) {
                                        return 0;
                                      }
                                      if ((pCol->colFlags & 0x60) != 0) {
                                        pEVar5 = sqlite3ColumnExpr(pTab,pCol_00);
                                        pEVar6 = sqlite3ColumnExpr(pDest,pCol);
                                        iVar2 = sqlite3ExprCompare((Parse *)0x0,pEVar5,pEVar6,-1);
                                        if (iVar2 != 0) {
                                          return 0;
                                        }
                                      }
                                      if (pCol->affinity != pCol_00->affinity) {
                                        return 0;
                                      }
                                      zLeft = sqlite3ColumnColl(pCol);
                                      zRight = sqlite3ColumnColl(pCol_00);
                                      iVar2 = sqlite3_stricmp(zLeft,zRight);
                                      if (iVar2 != 0) {
                                        return 0;
                                      }
                                      if (((pCol->field_0x8 & 0xf) != 0) &&
                                         ((pCol_00->field_0x8 & 0xf) == 0)) {
                                        return 0;
                                      }
                                      if (((pCol->colFlags & 0x60) == 0) && (0 < iSrc)) {
                                        pEVar5 = sqlite3ColumnExpr(pDest,pCol);
                                        pEVar6 = sqlite3ColumnExpr(pTab,pCol_00);
                                        if (((pEVar5 == (Expr *)0x0) != (pEVar6 == (Expr *)0x0)) ||
                                           ((pEVar5 != (Expr *)0x0 &&
                                            (iVar2 = strcmp((pEVar5->u).zToken,(pEVar6->u).zToken),
                                            iVar2 != 0)))) {
                                          return 0;
                                        }
                                      }
                                    }
                                    for (pItem = (SrcItem *)pDest->pIndex; pItem != (SrcItem *)0x0;
                                        pItem = (SrcItem *)pItem->pSelect) {
                                      if (*(char *)((long)&pItem->u2 + 2) != '\0') {
                                        bVar1 = true;
                                      }
                                      pDestIdx = pTab->pIndex;
                                      while ((pDestIdx != (Index *)0x0 &&
                                             (iVar2 = xferCompatibleIndex((Index *)pItem,pDestIdx),
                                             iVar2 == 0))) {
                                        pDestIdx = pDestIdx->pNext;
                                      }
                                      if (pDestIdx == (Index *)0x0) {
                                        return 0;
                                      }
                                      if (((pDestIdx->tnum == *(Pgno *)&pItem->u1) &&
                                          (pTab->pSchema == pDest->pSchema)) &&
                                         (iVar2 = sqlite3FaultSim(0x19b), iVar2 == 0)) {
                                        return 0;
                                      }
                                    }
                                    if ((pDest->pCheck == (ExprList *)0x0) ||
                                       (iVar2 = sqlite3ExprListCompare
                                                          (pTab->pCheck,pDest->pCheck,-1),
                                       iVar2 == 0)) {
                                      if (((db_00->flags & 0x4000) == 0) ||
                                         ((pDest->u).tab.pFKey == (FKey *)0x0)) {
                                        if ((db_00->flags & 0x100000000) == 0) {
                                          iDb = sqlite3SchemaToIndex(db_00,pTab->pSchema);
                                          p = sqlite3GetVdbe(pParse);
                                          sqlite3CodeVerifySchema(pParse,iDb);
                                          iVar2 = pParse->nTab;
                                          pParse->nTab = iVar2 + 1;
                                          iCur = pParse->nTab;
                                          pParse->nTab = iCur + 1;
                                          iVar3 = autoIncBegin(pParse,iDbDest,pDest);
                                          p2 = sqlite3GetTempReg(pParse);
                                          sqlite3VdbeAddOp2(p,0x4b,0,p2);
                                          p2_00 = sqlite3GetTempReg(pParse);
                                          sqlite3OpenTable(pParse,iCur,iDbDest,pDest,0x71);
                                          if (((db_00->mDbFlags & 4) == 0) &&
                                             (((pDest->iPKey < 0 && (pDest->pIndex != (Index *)0x0))
                                              || ((bVar1 || ((db._4_4_ != 2 && (db._4_4_ != 1)))))))
                                             ) {
                                            iVar4 = sqlite3VdbeAddOp2(p,0x23,iCur,0);
                                            v._4_4_ = sqlite3VdbeAddOp0(p,8);
                                            sqlite3VdbeJumpHere(p,iVar4);
                                          }
                                          if ((pTab->tabFlags & 0x80) == 0) {
                                            sqlite3OpenTable(pParse,iVar2,iDb,pTab,0x70);
                                            v._0_4_ = sqlite3VdbeAddOp2(p,0x23,iVar2,0);
                                            if (pDest->iPKey < 0) {
                                              if ((pDest->pIndex == (Index *)0x0) &&
                                                 ((db_00->mDbFlags & 8) == 0)) {
                                                emptyDestTest = sqlite3VdbeAddOp2(p,0x7f,iCur,p2_00)
                                                ;
                                              }
                                              else {
                                                emptyDestTest =
                                                     sqlite3VdbeAddOp2(p,0x87,iVar2,p2_00);
                                              }
                                            }
                                            else {
                                              emptyDestTest = sqlite3VdbeAddOp2(p,0x87,iVar2,p2_00);
                                              if ((db_00->mDbFlags & 4) == 0) {
                                                iVar4 = sqlite3VdbeAddOp3(p,0x1e,iCur,0,p2_00);
                                                sqlite3RowidConstraint(pParse,db._4_4_,pDest);
                                                sqlite3VdbeJumpHere(p,iVar4);
                                              }
                                              autoIncStep(pParse,iVar3,p2_00);
                                            }
                                            if ((db_00->mDbFlags & 4) == 0) {
                                              zColl._7_1_ = 0xa9;
                                            }
                                            else {
                                              sqlite3VdbeAddOp1(p,0x89,iCur);
                                              zColl._7_1_ = 0x98;
                                            }
                                            sqlite3VdbeAddOp3(p,0x81,iCur,iVar2,p2_00);
                                            sqlite3VdbeAddOp3(p,0x80,iCur,p2,p2_00);
                                            if ((db_00->mDbFlags & 4) == 0) {
                                              sqlite3VdbeChangeP4(p,-1,(char *)pDest,-5);
                                            }
                                            sqlite3VdbeChangeP5(p,(ushort)zColl._7_1_);
                                            sqlite3VdbeAddOp2(p,0x26,iVar2,emptyDestTest);
                                            sqlite3VdbeAddOp2(p,0x7a,iVar2,0);
                                            sqlite3VdbeAddOp2(p,0x7a,iCur,0);
                                          }
                                          else {
                                            sqlite3TableLock(pParse,iDbDest,pDest->tnum,'\x01',
                                                             pDest->zName);
                                            sqlite3TableLock(pParse,iDb,pTab->tnum,'\0',pTab->zName)
                                            ;
                                          }
                                          for (pItem = (SrcItem *)pDest->pIndex;
                                              pItem != (SrcItem *)0x0;
                                              pItem = (SrcItem *)pItem->pSelect) {
                                            zColl._6_1_ = 0;
                                            pDestIdx = pTab->pIndex;
                                            while ((pDestIdx != (Index *)0x0 &&
                                                   (iVar3 = xferCompatibleIndex((Index *)pItem,
                                                                                pDestIdx),
                                                   iVar3 == 0))) {
                                              pDestIdx = pDestIdx->pNext;
                                            }
                                            sqlite3VdbeAddOp3(p,0x70,iVar2,pDestIdx->tnum,iDb);
                                            sqlite3VdbeSetP4KeyInfo(pParse,pDestIdx);
                                            sqlite3VdbeAddOp3(p,0x71,iCur,*(int *)&pItem->u1,iDbDest
                                                             );
                                            sqlite3VdbeSetP4KeyInfo(pParse,(Index *)pItem);
                                            sqlite3VdbeChangeP5(p,1);
                                            iVar3 = sqlite3VdbeAddOp2(p,0x23,iVar2,0);
                                            if ((db_00->mDbFlags & 4) == 0) {
                                              if (((pTab->tabFlags & 0x80) != 0) &&
                                                 (((ulong)(pItem->u2).pIBIndex & 0x3000000) ==
                                                  0x2000000)) {
                                                zColl._6_1_ = 1;
                                              }
                                            }
                                            else {
                                              iSrc = 0;
                                              while ((iSrc < (int)(uint)pDestIdx->nColumn &&
                                                     (iVar4 = sqlite3_stricmp("BINARY",pDestIdx->
                                                                                       azColl[iSrc])
                                                     , iVar4 == 0))) {
                                                iSrc = iSrc + 1;
                                              }
                                              if (iSrc == (uint)pDestIdx->nColumn) {
                                                zColl._6_1_ = 0x90;
                                                sqlite3VdbeAddOp1(p,0x89,iCur);
                                                sqlite3VdbeAddOp2(p,0x81,iCur,iVar2);
                                              }
                                            }
                                            if (zColl._6_1_ != 0x90) {
                                              sqlite3VdbeAddOp3(p,0x86,iVar2,p2,1);
                                            }
                                            sqlite3VdbeAddOp2(p,0x8a,iCur,p2);
                                            sqlite3VdbeChangeP5(p,zColl._6_1_ | 8);
                                            sqlite3VdbeAddOp2(p,0x26,iVar2,iVar3 + 1);
                                            sqlite3VdbeJumpHere(p,iVar3);
                                            sqlite3VdbeAddOp2(p,0x7a,iVar2,0);
                                            sqlite3VdbeAddOp2(p,0x7a,iCur,0);
                                          }
                                          if ((int)v != 0) {
                                            sqlite3VdbeJumpHere(p,(int)v);
                                          }
                                          sqlite3ReleaseTempReg(pParse,p2_00);
                                          sqlite3ReleaseTempReg(pParse,p2);
                                          if (v._4_4_ == 0) {
                                            pParse_local._4_4_ = 1;
                                          }
                                          else {
                                            sqlite3AutoincrementEnd(pParse);
                                            sqlite3VdbeAddOp2(p,0x46,0,0);
                                            sqlite3VdbeJumpHere(p,v._4_4_);
                                            sqlite3VdbeAddOp2(p,0x7a,iCur,0);
                                            pParse_local._4_4_ = 0;
                                          }
                                        }
                                        else {
                                          pParse_local._4_4_ = 0;
                                        }
                                      }
                                      else {
                                        pParse_local._4_4_ = 0;
                                      }
                                    }
                                    else {
                                      pParse_local._4_4_ = 0;
                                    }
                                  }
                                  else {
                                    pParse_local._4_4_ = 0;
                                  }
                                }
                                else {
                                  pParse_local._4_4_ = 0;
                                }
                              }
                              else {
                                pParse_local._4_4_ = 0;
                              }
                            }
                            else {
                              pParse_local._4_4_ = 0;
                            }
                          }
                          else {
                            pParse_local._4_4_ = 0;
                          }
                        }
                        else {
                          pParse_local._4_4_ = 0;
                        }
                      }
                      else {
                        pParse_local._4_4_ = 0;
                      }
                    }
                    else {
                      pParse_local._4_4_ = 0;
                    }
                  }
                  else {
                    pParse_local._4_4_ = 0;
                  }
                }
                else {
                  pParse_local._4_4_ = 0;
                }
              }
              else {
                pParse_local._4_4_ = 0;
              }
            }
            else {
              pParse_local._4_4_ = 0;
            }
          }
          else {
            pParse_local._4_4_ = 0;
          }
        }
        else {
          pParse_local._4_4_ = 0;
        }
      }
      else {
        pParse_local._4_4_ = 0;
      }
    }
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

static int xferOptimization(
  Parse *pParse,        /* Parser context */
  Table *pDest,         /* The table we are inserting into */
  Select *pSelect,      /* A SELECT statement to use as the data source */
  int onError,          /* How to handle constraint errors */
  int iDbDest           /* The database of pDest */
){
  sqlite3 *db = pParse->db;
  ExprList *pEList;                /* The result set of the SELECT */
  Table *pSrc;                     /* The table in the FROM clause of SELECT */
  Index *pSrcIdx, *pDestIdx;       /* Source and destination indices */
  SrcItem *pItem;                  /* An element of pSelect->pSrc */
  int i;                           /* Loop counter */
  int iDbSrc;                      /* The database of pSrc */
  int iSrc, iDest;                 /* Cursors from source and destination */
  int addr1, addr2;                /* Loop addresses */
  int emptyDestTest = 0;           /* Address of test for empty pDest */
  int emptySrcTest = 0;            /* Address of test for empty pSrc */
  Vdbe *v;                         /* The VDBE we are building */
  int regAutoinc;                  /* Memory register used by AUTOINC */
  int destHasUniqueIdx = 0;        /* True if pDest has a UNIQUE index */
  int regData, regRowid;           /* Registers holding data and rowid */

  assert( pSelect!=0 );
  if( pParse->pWith || pSelect->pWith ){
    /* Do not attempt to process this query if there are an WITH clauses
    ** attached to it. Proceeding may generate a false "no such table: xxx"
    ** error if pSelect reads from a CTE named "xxx".  */
    return 0;
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pDest) ){
    return 0;   /* tab1 must not be a virtual table */
  }
#endif
  if( onError==OE_Default ){
    if( pDest->iPKey>=0 ) onError = pDest->keyConf;
    if( onError==OE_Default ) onError = OE_Abort;
  }
  assert(pSelect->pSrc);   /* allocated even if there is no FROM clause */
  if( pSelect->pSrc->nSrc!=1 ){
    return 0;   /* FROM clause must have exactly one term */
  }
  if( pSelect->pSrc->a[0].pSelect ){
    return 0;   /* FROM clause cannot contain a subquery */
  }
  if( pSelect->pWhere ){
    return 0;   /* SELECT may not have a WHERE clause */
  }
  if( pSelect->pOrderBy ){
    return 0;   /* SELECT may not have an ORDER BY clause */
  }
  /* Do not need to test for a HAVING clause.  If HAVING is present but
  ** there is no ORDER BY, we will get an error. */
  if( pSelect->pGroupBy ){
    return 0;   /* SELECT may not have a GROUP BY clause */
  }
  if( pSelect->pLimit ){
    return 0;   /* SELECT may not have a LIMIT clause */
  }
  if( pSelect->pPrior ){
    return 0;   /* SELECT may not be a compound query */
  }
  if( pSelect->selFlags & SF_Distinct ){
    return 0;   /* SELECT may not be DISTINCT */
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );
  if( pEList->nExpr!=1 ){
    return 0;   /* The result set must have exactly one column */
  }
  assert( pEList->a[0].pExpr );
  if( pEList->a[0].pExpr->op!=TK_ASTERISK ){
    return 0;   /* The result set must be the special operator "*" */
  }

  /* At this point we have established that the statement is of the
  ** correct syntactic form to participate in this optimization.  Now
  ** we have to check the semantics.
  */
  pItem = pSelect->pSrc->a;
  pSrc = sqlite3LocateTableItem(pParse, 0, pItem);
  if( pSrc==0 ){
    return 0;   /* FROM clause does not contain a real table */
  }
  if( pSrc->tnum==pDest->tnum && pSrc->pSchema==pDest->pSchema ){
    testcase( pSrc!=pDest ); /* Possible due to bad sqlite_schema.rootpage */
    return 0;   /* tab1 and tab2 may not be the same table */
  }
  if( HasRowid(pDest)!=HasRowid(pSrc) ){
    return 0;   /* source and destination must both be WITHOUT ROWID or not */
  }
  if( !IsOrdinaryTable(pSrc) ){
    return 0;   /* tab2 may not be a view or virtual table */
  }
  if( pDest->nCol!=pSrc->nCol ){
    return 0;   /* Number of columns must be the same in tab1 and tab2 */
  }
  if( pDest->iPKey!=pSrc->iPKey ){
    return 0;   /* Both tables must have the same INTEGER PRIMARY KEY */
  }
  if( (pDest->tabFlags & TF_Strict)!=0 && (pSrc->tabFlags & TF_Strict)==0 ){
    return 0;   /* Cannot feed from a non-strict into a strict table */
  }
  for(i=0; i<pDest->nCol; i++){
    Column *pDestCol = &pDest->aCol[i];
    Column *pSrcCol = &pSrc->aCol[i];
#ifdef SQLITE_ENABLE_HIDDEN_COLUMNS
    if( (db->mDbFlags & DBFLAG_Vacuum)==0
     && (pDestCol->colFlags | pSrcCol->colFlags) & COLFLAG_HIDDEN
    ){
      return 0;    /* Neither table may have __hidden__ columns */
    }
#endif
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    /* Even if tables t1 and t2 have identical schemas, if they contain
    ** generated columns, then this statement is semantically incorrect:
    **
    **     INSERT INTO t2 SELECT * FROM t1;
    **
    ** The reason is that generated column values are returned by the
    ** the SELECT statement on the right but the INSERT statement on the
    ** left wants them to be omitted.
    **
    ** Nevertheless, this is a useful notational shorthand to tell SQLite
    ** to do a bulk transfer all of the content from t1 over to t2.
    **
    ** We could, in theory, disable this (except for internal use by the
    ** VACUUM command where it is actually needed).  But why do that?  It
    ** seems harmless enough, and provides a useful service.
    */
    if( (pDestCol->colFlags & COLFLAG_GENERATED) !=
        (pSrcCol->colFlags & COLFLAG_GENERATED) ){
      return 0;    /* Both columns have the same generated-column type */
    }
    /* But the transfer is only allowed if both the source and destination
    ** tables have the exact same expressions for generated columns.
    ** This requirement could be relaxed for VIRTUAL columns, I suppose.
    */
    if( (pDestCol->colFlags & COLFLAG_GENERATED)!=0 ){
      if( sqlite3ExprCompare(0,
             sqlite3ColumnExpr(pSrc, pSrcCol),
             sqlite3ColumnExpr(pDest, pDestCol), -1)!=0 ){
        testcase( pDestCol->colFlags & COLFLAG_VIRTUAL );
        testcase( pDestCol->colFlags & COLFLAG_STORED );
        return 0;  /* Different generator expressions */
      }
    }
#endif
    if( pDestCol->affinity!=pSrcCol->affinity ){
      return 0;    /* Affinity must be the same on all columns */
    }
    if( sqlite3_stricmp(sqlite3ColumnColl(pDestCol),
                        sqlite3ColumnColl(pSrcCol))!=0 ){
      return 0;    /* Collating sequence must be the same on all columns */
    }
    if( pDestCol->notNull && !pSrcCol->notNull ){
      return 0;    /* tab2 must be NOT NULL if tab1 is */
    }
    /* Default values for second and subsequent columns need to match. */
    if( (pDestCol->colFlags & COLFLAG_GENERATED)==0 && i>0 ){
      Expr *pDestExpr = sqlite3ColumnExpr(pDest, pDestCol);
      Expr *pSrcExpr = sqlite3ColumnExpr(pSrc, pSrcCol);
      assert( pDestExpr==0 || pDestExpr->op==TK_SPAN );
      assert( pDestExpr==0 || !ExprHasProperty(pDestExpr, EP_IntValue) );
      assert( pSrcExpr==0 || pSrcExpr->op==TK_SPAN );
      assert( pSrcExpr==0 || !ExprHasProperty(pSrcExpr, EP_IntValue) );
      if( (pDestExpr==0)!=(pSrcExpr==0)
       || (pDestExpr!=0 && strcmp(pDestExpr->u.zToken,
                                       pSrcExpr->u.zToken)!=0)
      ){
        return 0;    /* Default values must be the same for all columns */
      }
    }
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    if( IsUniqueIndex(pDestIdx) ){
      destHasUniqueIdx = 1;
    }
    for(pSrcIdx=pSrc->pIndex; pSrcIdx; pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    if( pSrcIdx==0 ){
      return 0;    /* pDestIdx has no corresponding index in pSrc */
    }
    if( pSrcIdx->tnum==pDestIdx->tnum && pSrc->pSchema==pDest->pSchema
         && sqlite3FaultSim(411)==SQLITE_OK ){
      /* The sqlite3FaultSim() call allows this corruption test to be
      ** bypassed during testing, in order to exercise other corruption tests
      ** further downstream. */
      return 0;   /* Corrupt schema - two indexes on the same btree */
    }
  }
#ifndef SQLITE_OMIT_CHECK
  if( pDest->pCheck && sqlite3ExprListCompare(pSrc->pCheck,pDest->pCheck,-1) ){
    return 0;   /* Tables have different CHECK constraints.  Ticket #2252 */
  }
#endif
#ifndef SQLITE_OMIT_FOREIGN_KEY
  /* Disallow the transfer optimization if the destination table constains
  ** any foreign key constraints.  This is more restrictive than necessary.
  ** But the main beneficiary of the transfer optimization is the VACUUM
  ** command, and the VACUUM command disables foreign key constraints.  So
  ** the extra complication to make this rule less restrictive is probably
  ** not worth the effort.  Ticket [6284df89debdfa61db8073e062908af0c9b6118e]
  */
  assert( IsOrdinaryTable(pDest) );
  if( (db->flags & SQLITE_ForeignKeys)!=0 && pDest->u.tab.pFKey!=0 ){
    return 0;
  }
#endif
  if( (db->flags & SQLITE_CountRows)!=0 ){
    return 0;  /* xfer opt does not play well with PRAGMA count_changes */
  }

  /* If we get this far, it means that the xfer optimization is at
  ** least a possibility, though it might only work if the destination
  ** table (tab1) is initially empty.
  */
#ifdef SQLITE_TEST
  sqlite3_xferopt_count++;
#endif
  iDbSrc = sqlite3SchemaToIndex(db, pSrc->pSchema);
  v = sqlite3GetVdbe(pParse);
  sqlite3CodeVerifySchema(pParse, iDbSrc);
  iSrc = pParse->nTab++;
  iDest = pParse->nTab++;
  regAutoinc = autoIncBegin(pParse, iDbDest, pDest);
  regData = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp2(v, OP_Null, 0, regData);
  regRowid = sqlite3GetTempReg(pParse);
  sqlite3OpenTable(pParse, iDest, iDbDest, pDest, OP_OpenWrite);
  assert( HasRowid(pDest) || destHasUniqueIdx );
  if( (db->mDbFlags & DBFLAG_Vacuum)==0 && (
      (pDest->iPKey<0 && pDest->pIndex!=0)          /* (1) */
   || destHasUniqueIdx                              /* (2) */
   || (onError!=OE_Abort && onError!=OE_Rollback)   /* (3) */
  )){
    /* In some circumstances, we are able to run the xfer optimization
    ** only if the destination table is initially empty. Unless the
    ** DBFLAG_Vacuum flag is set, this block generates code to make
    ** that determination. If DBFLAG_Vacuum is set, then the destination
    ** table is always empty.
    **
    ** Conditions under which the destination must be empty:
    **
    ** (1) There is no INTEGER PRIMARY KEY but there are indices.
    **     (If the destination is not initially empty, the rowid fields
    **     of index entries might need to change.)
    **
    ** (2) The destination has a unique index.  (The xfer optimization
    **     is unable to test uniqueness.)
    **
    ** (3) onError is something other than OE_Abort and OE_Rollback.
    */
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iDest, 0); VdbeCoverage(v);
    emptyDestTest = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, addr1);
  }
  if( HasRowid(pSrc) ){
    u8 insFlags;
    sqlite3OpenTable(pParse, iSrc, iDbSrc, pSrc, OP_OpenRead);
    emptySrcTest = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    if( pDest->iPKey>=0 ){
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      if( (db->mDbFlags & DBFLAG_Vacuum)==0 ){
        sqlite3VdbeVerifyAbortable(v, onError);
        addr2 = sqlite3VdbeAddOp3(v, OP_NotExists, iDest, 0, regRowid);
        VdbeCoverage(v);
        sqlite3RowidConstraint(pParse, onError, pDest);
        sqlite3VdbeJumpHere(v, addr2);
      }
      autoIncStep(pParse, regAutoinc, regRowid);
    }else if( pDest->pIndex==0 && !(db->mDbFlags & DBFLAG_VacuumInto) ){
      addr1 = sqlite3VdbeAddOp2(v, OP_NewRowid, iDest, regRowid);
    }else{
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      assert( (pDest->tabFlags & TF_Autoincrement)==0 );
    }

    if( db->mDbFlags & DBFLAG_Vacuum ){
      sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
      insFlags = OPFLAG_APPEND|OPFLAG_USESEEKRESULT|OPFLAG_PREFORMAT;
    }else{
      insFlags = OPFLAG_NCHANGE|OPFLAG_LASTROWID|OPFLAG_APPEND|OPFLAG_PREFORMAT;
    }
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    if( (db->mDbFlags & DBFLAG_Vacuum)==0 ){
      sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
      insFlags &= ~OPFLAG_PREFORMAT;
    }else
#endif
    {
      sqlite3VdbeAddOp3(v, OP_RowCell, iDest, iSrc, regRowid);
    }
    sqlite3VdbeAddOp3(v, OP_Insert, iDest, regData, regRowid);
    if( (db->mDbFlags & DBFLAG_Vacuum)==0 ){
      sqlite3VdbeChangeP4(v, -1, (char*)pDest, P4_TABLE);
    }
    sqlite3VdbeChangeP5(v, insFlags);

    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }else{
    sqlite3TableLock(pParse, iDbDest, pDest->tnum, 1, pDest->zName);
    sqlite3TableLock(pParse, iDbSrc, pSrc->tnum, 0, pSrc->zName);
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    u8 idxInsFlags = 0;
    for(pSrcIdx=pSrc->pIndex; ALWAYS(pSrcIdx); pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    assert( pSrcIdx );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iSrc, pSrcIdx->tnum, iDbSrc);
    sqlite3VdbeSetP4KeyInfo(pParse, pSrcIdx);
    VdbeComment((v, "%s", pSrcIdx->zName));
    sqlite3VdbeAddOp3(v, OP_OpenWrite, iDest, pDestIdx->tnum, iDbDest);
    sqlite3VdbeSetP4KeyInfo(pParse, pDestIdx);
    sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR);
    VdbeComment((v, "%s", pDestIdx->zName));
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    if( db->mDbFlags & DBFLAG_Vacuum ){
      /* This INSERT command is part of a VACUUM operation, which guarantees
      ** that the destination table is empty. If all indexed columns use
      ** collation sequence BINARY, then it can also be assumed that the
      ** index will be populated by inserting keys in strictly sorted
      ** order. In this case, instead of seeking within the b-tree as part
      ** of every OP_IdxInsert opcode, an OP_SeekEnd is added before the
      ** OP_IdxInsert to seek to the point within the b-tree where each key
      ** should be inserted. This is faster.
      **
      ** If any of the indexed columns use a collation sequence other than
      ** BINARY, this optimization is disabled. This is because the user
      ** might change the definition of a collation sequence and then run
      ** a VACUUM command. In that case keys may not be written in strictly
      ** sorted order.  */
      for(i=0; i<pSrcIdx->nColumn; i++){
        const char *zColl = pSrcIdx->azColl[i];
        if( sqlite3_stricmp(sqlite3StrBINARY, zColl) ) break;
      }
      if( i==pSrcIdx->nColumn ){
        idxInsFlags = OPFLAG_USESEEKRESULT|OPFLAG_PREFORMAT;
        sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
        sqlite3VdbeAddOp2(v, OP_RowCell, iDest, iSrc);
      }
    }else if( !HasRowid(pSrc) && pDestIdx->idxType==SQLITE_IDXTYPE_PRIMARYKEY ){
      idxInsFlags |= OPFLAG_NCHANGE;
    }
    if( idxInsFlags!=(OPFLAG_USESEEKRESULT|OPFLAG_PREFORMAT) ){
      sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
      if( (db->mDbFlags & DBFLAG_Vacuum)==0
       && !HasRowid(pDest)
       && IsPrimaryKeyIndex(pDestIdx)
      ){
        codeWithoutRowidPreupdate(pParse, pDest, iDest, regData);
      }
    }
    sqlite3VdbeAddOp2(v, OP_IdxInsert, iDest, regData);
    sqlite3VdbeChangeP5(v, idxInsFlags|OPFLAG_APPEND);
    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }
  if( emptySrcTest ) sqlite3VdbeJumpHere(v, emptySrcTest);
  sqlite3ReleaseTempReg(pParse, regRowid);
  sqlite3ReleaseTempReg(pParse, regData);
  if( emptyDestTest ){
    sqlite3AutoincrementEnd(pParse);
    sqlite3VdbeAddOp2(v, OP_Halt, SQLITE_OK, 0);
    sqlite3VdbeJumpHere(v, emptyDestTest);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
    return 0;
  }else{
    return 1;
  }
}